

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock_setup.cpp
# Opt level: O2

VulkanMock * get_and_setup_default(void)

{
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *this;
  VulkanMock *mock;
  VkExtensionProperties local_11c;
  
  mock = (VulkanMock *)get_vulkan_mock();
  this = &mock->instance_extensions;
  get_extension_properties(&local_11c,"VK_KHR_surface");
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
  emplace_back<VkExtensionProperties>(this,&local_11c);
  get_extension_properties(&local_11c,"VK_KHR_xcb_surface");
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
  emplace_back<VkExtensionProperties>(this,&local_11c);
  get_extension_properties(&local_11c,"VK_KHR_xlib_surface");
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
  emplace_back<VkExtensionProperties>(this,&local_11c);
  get_extension_properties(&local_11c,"VK_KHR_wayland_surface");
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
  emplace_back<VkExtensionProperties>(this,&local_11c);
  get_extension_properties(&local_11c,"VK_EXT_debug_utils");
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
  emplace_back<VkExtensionProperties>(this,&local_11c);
  add_basic_physical_device(mock);
  return mock;
}

Assistant:

VulkanMock& get_and_setup_default() {
    VulkanMock& mock = *get_vulkan_mock();
    mock.instance_extensions.push_back(get_extension_properties(VK_KHR_SURFACE_EXTENSION_NAME));
#if defined(_WIN32)
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_win32_surface"));
#elif defined(__ANDROID__)
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_android_surface"));
#elif defined(_DIRECT2DISPLAY)
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_display"));
#elif defined(__linux__) || defined(__FreeBSD__)
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_xcb_surface"));
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_xlib_surface"));
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_wayland_surface"));
#elif defined(__APPLE__)
    mock.instance_extensions.push_back(get_extension_properties("VK_EXT_metal_surface"));
#endif
    mock.instance_extensions.push_back(get_extension_properties(VK_EXT_DEBUG_UTILS_EXTENSION_NAME));
    add_basic_physical_device(mock);
    return mock;
}